

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O3

bool google::protobuf::compiler::cpp::HasLazyFields(Descriptor *descriptor,Options *options)

{
  long lVar1;
  once_flag *poVar2;
  bool bVar3;
  long lVar4;
  long lVar5;
  FieldDescriptor *local_40;
  _func_void_FieldDescriptor_ptr *local_38;
  
  if (0 < *(int *)(descriptor + 0x68)) {
    lVar5 = 0;
    lVar4 = 0;
    do {
      lVar1 = *(long *)(descriptor + 0x28);
      if ((*(char *)(*(long *)(lVar1 + 0x78 + lVar5) + 0x4d) == '\x01') &&
         (*(int *)(lVar1 + 0x3c + lVar5) != 3)) {
        poVar2 = *(once_flag **)(lVar1 + 0x30 + lVar5);
        if (poVar2 != (once_flag *)0x0) {
          local_40 = (FieldDescriptor *)(lVar1 + lVar5);
          local_38 = FieldDescriptor::TypeOnceInit;
          std::
          call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                    (poVar2,&local_38,&local_40);
        }
        if (*(int *)(lVar1 + 0x38 + lVar5) == 0xb) {
          if (options->enforce_mode == kSpeed) {
            if (options->opensource_runtime != true) {
              return true;
            }
          }
          else if (((options->enforce_mode != kLiteRuntime) &&
                   (*(int *)(*(long *)(*(long *)(lVar1 + 0x28 + lVar5) + 0x88) + 0xa4) != 3)) &&
                  ((options->opensource_runtime & 1U) == 0)) {
            return true;
          }
        }
      }
      lVar4 = lVar4 + 1;
      lVar5 = lVar5 + 0x98;
    } while (lVar4 < *(int *)(descriptor + 0x68));
  }
  if (0 < *(int *)(descriptor + 0x7c)) {
    lVar5 = 0;
    lVar4 = 0;
    do {
      lVar1 = *(long *)(descriptor + 0x50);
      if ((*(char *)(*(long *)(lVar1 + 0x78 + lVar5) + 0x4d) == '\x01') &&
         (*(int *)(lVar1 + 0x3c + lVar5) != 3)) {
        poVar2 = *(once_flag **)(lVar1 + 0x30 + lVar5);
        if (poVar2 != (once_flag *)0x0) {
          local_40 = (FieldDescriptor *)(lVar1 + lVar5);
          local_38 = FieldDescriptor::TypeOnceInit;
          std::
          call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                    (poVar2,&local_38,&local_40);
        }
        if (*(int *)(lVar1 + 0x38 + lVar5) == 0xb) {
          if (options->enforce_mode == kSpeed) {
            if (options->opensource_runtime != true) {
              return true;
            }
          }
          else if (((options->enforce_mode != kLiteRuntime) &&
                   (*(int *)(*(long *)(*(long *)(lVar1 + 0x28 + lVar5) + 0x88) + 0xa4) != 3)) &&
                  ((options->opensource_runtime & 1U) == 0)) {
            return true;
          }
        }
      }
      lVar4 = lVar4 + 1;
      lVar5 = lVar5 + 0x98;
    } while (lVar4 < *(int *)(descriptor + 0x7c));
  }
  if (*(int *)(descriptor + 0x70) < 1) {
    bVar3 = false;
  }
  else {
    lVar5 = 0;
    lVar4 = 0;
    do {
      bVar3 = HasLazyFields((Descriptor *)(*(long *)(descriptor + 0x38) + lVar5),options);
      if (bVar3) {
        return bVar3;
      }
      lVar4 = lVar4 + 1;
      lVar5 = lVar5 + 0x90;
    } while (lVar4 < *(int *)(descriptor + 0x70));
  }
  return bVar3;
}

Assistant:

static bool HasLazyFields(const Descriptor* descriptor,
                          const Options& options) {
  for (int field_idx = 0; field_idx < descriptor->field_count(); field_idx++) {
    if (IsLazy(descriptor->field(field_idx), options)) {
      return true;
    }
  }
  for (int idx = 0; idx < descriptor->extension_count(); idx++) {
    if (IsLazy(descriptor->extension(idx), options)) {
      return true;
    }
  }
  for (int idx = 0; idx < descriptor->nested_type_count(); idx++) {
    if (HasLazyFields(descriptor->nested_type(idx), options)) {
      return true;
    }
  }
  return false;
}